

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndReplace
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *result,
          int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  undefined4 uVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  char16_t *compiledPattern;
  int iVar5;
  UnicodeString *__filename;
  int local_a0;
  int32_t n;
  int32_t i;
  undefined1 local_90 [8];
  UnicodeString resultCopy;
  int32_t firstArg;
  int32_t cpLength;
  UChar *cp;
  int32_t offsetsLength_local;
  int32_t *offsets_local;
  UnicodeString *result_local;
  int32_t valuesLength_local;
  UnicodeString **values_local;
  SimpleFormatter *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  this_local = (SimpleFormatter *)result;
  if (UVar2 == '\0') {
    UVar2 = anon_unknown_0::isInvalidArray(values,valuesLength);
    if ((UVar2 == '\0') &&
       (UVar2 = anon_unknown_0::isInvalidArray(offsets,offsetsLength), UVar2 == '\0')) {
      compiledPattern = UnicodeString::getBuffer(&this->compiledPattern);
      resultCopy.fUnion._52_4_ = UnicodeString::length(&this->compiledPattern);
      iVar3 = getArgumentLimit(compiledPattern,resultCopy.fUnion._52_4_);
      if (valuesLength < iVar3) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        resultCopy.fUnion._48_4_ = 0xffffffff;
        UnicodeString::UnicodeString((UnicodeString *)local_90);
        __filename = (UnicodeString *)(ulong)(uint)resultCopy.fUnion._52_4_;
        iVar3 = getArgumentLimit(compiledPattern,resultCopy.fUnion._52_4_);
        if (0 < iVar3) {
          local_a0 = 1;
          uVar1 = resultCopy.fUnion._48_4_;
          while (resultCopy.fUnion._48_4_ = uVar1, local_a0 < (int)resultCopy.fUnion._52_4_) {
            iVar5 = local_a0 + 1;
            uVar4 = (uint)(ushort)compiledPattern[local_a0];
            uVar1 = resultCopy.fUnion._48_4_;
            if (uVar4 < 0x100) {
              local_a0 = iVar5;
              if ((((values[(int)uVar4] == result) && (uVar1 = uVar4, iVar5 != 2)) &&
                  (UVar2 = UnicodeString::isEmpty((UnicodeString *)local_90),
                  uVar1 = resultCopy.fUnion._48_4_, UVar2 != '\0')) &&
                 (UVar2 = UnicodeString::isEmpty(result), uVar1 = resultCopy.fUnion._48_4_,
                 UVar2 == '\0')) {
                __filename = result;
                UnicodeString::operator=((UnicodeString *)local_90,result);
                uVar1 = resultCopy.fUnion._48_4_;
              }
            }
            else {
              local_a0 = (uVar4 - 0x100) + iVar5;
            }
          }
        }
        if ((int)resultCopy.fUnion._48_4_ < 0) {
          UnicodeString::remove(result,(char *)__filename);
        }
        this_local = (SimpleFormatter *)
                     format(compiledPattern,resultCopy.fUnion._52_4_,values,result,
                            (UnicodeString *)local_90,'\0',offsets,offsetsLength,errorCode);
        UnicodeString::~UnicodeString((UnicodeString *)local_90);
      }
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString &SimpleFormatter::formatAndReplace(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &result,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    const UChar *cp = compiledPattern.getBuffer();
    int32_t cpLength = compiledPattern.length();
    if (valuesLength < getArgumentLimit(cp, cpLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    // If the pattern starts with an argument whose value is the same object
    // as the result, then we keep the result contents and append to it.
    // Otherwise we replace its contents.
    int32_t firstArg = -1;
    // If any non-initial argument value is the same object as the result,
    // then we first copy its contents and use that instead while formatting.
    UnicodeString resultCopy;
    if (getArgumentLimit(cp, cpLength) > 0) {
        for (int32_t i = 1; i < cpLength;) {
            int32_t n = cp[i++];
            if (n < ARG_NUM_LIMIT) {
                if (values[n] == &result) {
                    if (i == 2) {
                        firstArg = n;
                    } else if (resultCopy.isEmpty() && !result.isEmpty()) {
                        resultCopy = result;
                    }
                }
            } else {
                i += n - ARG_NUM_LIMIT;
            }
        }
    }
    if (firstArg < 0) {
        result.remove();
    }
    return format(cp, cpLength, values,
                  result, &resultCopy, FALSE,
                  offsets, offsetsLength, errorCode);
}